

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

bool __thiscall ftxui::SliderBase<float>::OnMouseEvent(SliderBase<float> *this,Event *event)

{
  int iVar1;
  CapturedMouseInterface *pCVar2;
  float *pfVar3;
  CapturedMouseInterface *pCVar4;
  bool bVar5;
  float fVar6;
  CapturedMouseInterface *local_20;
  
  pCVar2 = (this->captured_mouse_)._M_t.
           super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
           .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
  if ((pCVar2 != (CapturedMouseInterface *)0x0) && ((event->field_1).mouse_.motion == Released)) {
    (this->captured_mouse_)._M_t.
    super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
    .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
         (CapturedMouseInterface *)0x0;
    (*pCVar2->_vptr_CapturedMouseInterface[1])();
    return true;
  }
  bVar5 = Box::Contain(&this->box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y);
  if ((bVar5) &&
     (ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this),
     local_20 != (CapturedMouseInterface *)0x0)) {
    (*local_20->_vptr_CapturedMouseInterface[1])();
    ComponentBase::TakeFocus(&this->super_ComponentBase);
  }
  if ((((event->field_1).mouse_.button == Left) && ((event->field_1).mouse_.motion == Pressed)) &&
     (bVar5 = Box::Contain(&this->gauge_box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y),
     bVar5)) {
    if ((this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl !=
        (CapturedMouseInterface *)0x0) goto LAB_0013b228;
    ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this);
    pCVar4 = local_20;
    local_20 = (CapturedMouseInterface *)0x0;
    pCVar2 = (this->captured_mouse_)._M_t.
             super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
             .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
    (this->captured_mouse_)._M_t.
    super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
    .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl = pCVar4;
    if ((pCVar2 != (CapturedMouseInterface *)0x0) &&
       ((*pCVar2->_vptr_CapturedMouseInterface[1])(), local_20 != (CapturedMouseInterface *)0x0)) {
      (**(code **)(*(_func_int **)local_20 + 8))();
    }
  }
  if ((this->captured_mouse_)._M_t.
      super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
      .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl ==
      (CapturedMouseInterface *)0x0) {
    return false;
  }
LAB_0013b228:
  iVar1 = (this->gauge_box_).x_min;
  fVar6 = ((this->max_ - this->min_) * (float)((event->field_1).mouse_.x - iVar1)) /
          (float)((this->gauge_box_).x_max - iVar1) + this->min_;
  pfVar3 = this->value_;
  *pfVar3 = fVar6;
  if (this->max_ <= fVar6) {
    fVar6 = this->max_;
  }
  if (fVar6 <= this->min_) {
    fVar6 = this->min_;
  }
  *pfVar3 = fVar6;
  return true;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (captured_mouse_ && event.mouse().motion == Mouse::Released) {
      captured_mouse_ = nullptr;
      return true;
    }

    if (box_.Contain(event.mouse().x, event.mouse().y) && CaptureMouse(event)) {
      TakeFocus();
    }

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed &&
        gauge_box_.Contain(event.mouse().x, event.mouse().y) &&
        !captured_mouse_) {
      captured_mouse_ = CaptureMouse(event);
    }

    if (captured_mouse_) {
      *value_ = min_ + (event.mouse().x - gauge_box_.x_min) * (max_ - min_) /
                           (gauge_box_.x_max - gauge_box_.x_min);
      *value_ = std::max(min_, std::min(max_, *value_));
      return true;
    }
    return false;
  }